

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

size_t mp_get_nbits(mp_int *x)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t *in_R8;
  long lVar4;
  size_t hiword_index;
  uint64_t hiword64;
  
  hiword_index = 0xffffffffffffffff;
  hiword64 = 0xffffffffffffffff;
  lVar4 = 0;
  mp_find_highest_nonzero_word_pair(x,(size_t)&hiword_index,&hiword64,(uint64_t *)0x0,in_R8);
  for (uVar1 = 0x20; uVar1 != 0; uVar1 = uVar1 >> 1) {
    uVar2 = hiword64 >> (sbyte)uVar1;
    uVar3 = uVar2;
    if (uVar2 != 0) {
      uVar3 = uVar1;
      hiword64 = uVar2;
    }
    lVar4 = lVar4 + uVar3;
  }
  return hiword_index * 0x40 + lVar4 + 1;
}

Assistant:

size_t mp_get_nbits(mp_int *x)
{
    /* Sentinel values in case there are no bits set at all: we
     * imagine that there's a word at position -1 (i.e. the topmost
     * fraction word) which is all 1s, because that way, we handle a
     * zero input by considering its highest set bit to be the top one
     * of that word, i.e. just below the units digit, i.e. at bit
     * index -1, i.e. so we'll return 0 on output. */
    size_t hiword_index = -(size_t)1;
    uint64_t hiword64 = ~(BignumInt)0;

    /*
     * Find the highest nonzero word and its index.
     */
    mp_find_highest_nonzero_word_pair(x, 0, &hiword_index, &hiword64, NULL);
    BignumInt hiword = hiword64; /* in case BignumInt is a narrower type */

    /*
     * Find the index of the highest set bit within hiword.
     */
    BignumInt hibit_index = 0;
    for (size_t i = (1 << (BIGNUM_INT_BITS_BITS-1)); i != 0; i >>= 1) {
        BignumInt shifted_word = hiword >> i;
        BignumInt indicator =
            (BignumInt)(-shifted_word) >> (BIGNUM_INT_BITS-1);
        hiword ^= (shifted_word ^ hiword ) & -indicator;
        hibit_index += i & -(size_t)indicator;
    }

    /*
     * Put together the result.
     */
    return (hiword_index << BIGNUM_INT_BITS_BITS) + hibit_index + 1;
}